

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O0

void * uripOpen(char *URI)

{
  int iVar1;
  size_t sVar2;
  char *URI_local;
  
  if ((URI != (char *)0x0) && (iVar1 = strcmp(URI,"file:///usr/local/etc/xml/catalog"), iVar1 != 0))
  {
    iVar1 = strcmp(urip_rcvsURLs[urip_current],URI);
    if (iVar1 != 0) {
      urip_success = 0;
    }
    urip_cur = urip_res;
    sVar2 = strlen(urip_res);
    urip_rlen = (int)sVar2;
    return urip_cur;
  }
  return (void *)0x0;
}

Assistant:

static void *
uripOpen(const char * URI) {
    if ((URI == NULL) || (!strcmp(URI, "file://" SYSCONFDIR "/xml/catalog")))
        return(NULL);
    /* Verify we received the escaped URL */
    if (strcmp(urip_rcvsURLs[urip_current], URI))
	urip_success = 0;
    urip_cur = urip_res;
    urip_rlen = strlen(urip_res);
    return((void *) urip_cur);
}